

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDsdSave(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  If_DsdMan_t *pIVar4;
  char *pcVar5;
  int fSecond;
  int c;
  int nArgcNew;
  char **pArgvNew;
  char *FileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"bh"), iVar2 != -1) {
    if (iVar2 != 0x62) {
      Abc_Print(-2,"usage: dsd_save [-bh] <file>\n");
      Abc_Print(-2,"\t         saves DSD manager into a file\n");
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggles processing second manager [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : (optional) file name to write\n");
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (argc - globalUtilOptind == 1) {
    pcVar5 = argv[globalUtilOptind];
    if (bVar1) {
      pvVar3 = Abc_FrameReadManDsd2();
      if (pvVar3 == (void *)0x0) {
        Abc_Print(-1,"The DSD manager is not started.\n");
        return 1;
      }
      pIVar4 = (If_DsdMan_t *)Abc_FrameReadManDsd2();
      If_DsdManSave(pIVar4,pcVar5);
    }
    else {
      pvVar3 = Abc_FrameReadManDsd();
      if (pvVar3 == (void *)0x0) {
        Abc_Print(-1,"The DSD manager is not started.\n");
        return 1;
      }
      pIVar4 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      If_DsdManSave(pIVar4,pcVar5);
    }
    pAbc_local._4_4_ = 0;
  }
  else {
    Abc_Print(-1,"File name is not given on the command line.\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandDsdSave( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * FileName;
    char ** pArgvNew;
    int nArgcNew;
    int c, fSecond = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fSecond ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    // get the input file name
    FileName = (nArgcNew == 1) ? pArgvNew[0] : NULL;
    if ( fSecond )
    {
        if ( !Abc_FrameReadManDsd2() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 1;
        }
        If_DsdManSave( (If_DsdMan_t *)Abc_FrameReadManDsd2(), FileName );
    }
    else
    {
        if ( !Abc_FrameReadManDsd() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 1;
        }
        If_DsdManSave( (If_DsdMan_t *)Abc_FrameReadManDsd(), FileName );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_save [-bh] <file>\n" );
    Abc_Print( -2, "\t         saves DSD manager into a file\n");
    Abc_Print( -2, "\t-b     : toggles processing second manager [default = %s]\n", fSecond? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : (optional) file name to write\n");
    return 1;
}